

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

ssize_t __thiscall
phosg::StringReader::pread_abi_cxx11_
          (StringReader *this,int __fd,void *__buf,size_t __nbytes,__off_t __offset)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  undefined4 in_register_00000034;
  
  pvVar1 = *(void **)(CONCAT44(in_register_00000034,__fd) + 0x20);
  if (__buf < pvVar1) {
    lVar2 = *(long *)(CONCAT44(in_register_00000034,__fd) + 0x18);
    lVar3 = (long)__buf + lVar2;
    this->_vptr_StringReader =
         (_func_int **)
         &(this->owned_data).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
    if (pvVar1 < (void *)(__nbytes + (long)__buf)) {
      lVar2 = lVar2 + (long)pvVar1;
    }
    else {
      lVar2 = __nbytes + lVar3;
    }
    ::std::__cxx11::string::_M_construct<char_const*>((string *)this,lVar3,lVar2);
  }
  else {
    this->_vptr_StringReader =
         (_func_int **)
         &(this->owned_data).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
    (this->owned_data).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    *(undefined1 *)
     &(this->owned_data).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = 0;
  }
  return (ssize_t)this;
}

Assistant:

string StringReader::pread(size_t offset, size_t size) const {
  if (offset >= this->length) {
    return string();
  }
  if (offset + size > this->length) {
    return string(reinterpret_cast<const char*>(this->data + offset), this->length - offset);
  }
  return string(reinterpret_cast<const char*>(this->data + offset), size);
}